

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * __thiscall cmTarget::GetSafeProperty(cmTarget *this,string *prop)

{
  bool bVar1;
  int iVar2;
  cmValue local_28;
  cmValue ret;
  string *prop_local;
  cmTarget *this_local;
  
  ret.Value = prop;
  local_28 = GetProperty(this,prop);
  bVar1 = cmValue::operator_cast_to_bool(&local_28);
  if (bVar1) {
    this_local = (cmTarget *)cmValue::operator*[abi_cxx11_(&local_28);
  }
  else {
    if (GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_)
      ;
      if (iVar2 != 0) {
        std::__cxx11::string::string
                  ((string *)&GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_);
        __cxa_atexit(std::__cxx11::string::~string,
                     &GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_,&__dso_handle
                    );
        __cxa_guard_release(&GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_);
      }
    }
    this_local = (cmTarget *)&GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_;
  }
  return (string *)this_local;
}

Assistant:

std::string const& cmTarget::GetSafeProperty(std::string const& prop) const
{
  cmValue ret = this->GetProperty(prop);
  if (ret) {
    return *ret;
  }

  static std::string const s_empty;
  return s_empty;
}